

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_uint64 ma_dr_wav_read_pcm_frames_le(ma_dr_wav *pWav,ma_uint64 framesToRead,void *pBufferOut)

{
  ushort uVar1;
  ma_uint64 mVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (framesToRead == 0 || pWav == (ma_dr_wav *)0x0) {
    return 0;
  }
  uVar1 = pWav->translatedFormatTag;
  if ((uVar1 == 2) || (uVar1 == 0x11)) {
    return 0;
  }
  uVar4 = pWav->totalPCMFrameCount - pWav->readCursorInPCMFrames;
  if (framesToRead <= uVar4) {
    uVar4 = framesToRead;
  }
  if ((pWav->bitsPerSample & 7) == 0) {
    uVar3 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
  }
  else {
    uVar3 = (uint)(pWav->fmt).blockAlign;
  }
  if ((uVar1 & 0xfffe) == 6) {
    if (uVar3 == 0) {
      return 0;
    }
    if (uVar3 != (pWav->fmt).channels) {
      return 0;
    }
  }
  else if (uVar3 == 0) {
    return 0;
  }
  sVar5 = uVar4 * uVar3;
  if (sVar5 == 0) {
    mVar2 = 0;
  }
  else {
    sVar5 = ma_dr_wav_read_raw(pWav,sVar5,pBufferOut);
    mVar2 = sVar5 / uVar3;
  }
  return mVar2;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_le(ma_dr_wav* pWav, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint32 bytesPerFrame;
    ma_uint64 bytesToRead;
    ma_uint64 framesRemainingInFile;
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (ma_dr_wav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }
    framesRemainingInFile = pWav->totalPCMFrameCount - pWav->readCursorInPCMFrames;
    if (framesToRead > framesRemainingInFile) {
        framesToRead = framesRemainingInFile;
    }
    bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }
    bytesToRead = framesToRead * bytesPerFrame;
    if (bytesToRead > MA_SIZE_MAX) {
        bytesToRead = (MA_SIZE_MAX / bytesPerFrame) * bytesPerFrame;
    }
    if (bytesToRead == 0) {
        return 0;
    }
    return ma_dr_wav_read_raw(pWav, (size_t)bytesToRead, pBufferOut) / bytesPerFrame;
}